

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_im2col_back_f32(ggml_compute_params *params,ggml_tensor *dst)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ggml_tensor *pgVar9;
  ggml_tensor *pgVar10;
  long lVar11;
  long lVar12;
  void *pvVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int64_t tmph;
  long lVar21;
  char *pcVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  undefined8 uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  bool bVar35;
  float fVar36;
  long local_118;
  long local_108;
  long local_100;
  long local_f8;
  long local_d8;
  long local_c0;
  
  pgVar9 = dst->src[0];
  if (pgVar9->type == GGML_TYPE_F32) {
    pgVar10 = dst->src[1];
    if (pgVar10->type == GGML_TYPE_F32) {
      if (dst->type == GGML_TYPE_F32) {
        iVar1 = dst->op_params[6];
        lVar24 = dst->ne[1];
        iVar16 = (int)dst->nb[2];
        bVar35 = iVar1 != 1;
        lVar28 = dst->ne[2];
        lVar15 = dst->ne[3];
        if (bVar35) {
          lVar28 = lVar24;
          lVar15 = dst->ne[2];
        }
        if (bVar35) {
          lVar24 = 1;
        }
        lVar25 = pgVar10->ne[1];
        if (bVar35) {
          lVar25 = 1;
        }
        lVar29 = 1;
        if (!bVar35) {
          lVar29 = pgVar9->ne[2];
        }
        iVar23 = (int)dst->nb[3];
        if (bVar35) {
          iVar23 = iVar16;
        }
        if (bVar35) {
          iVar16 = (int)dst->nb[1];
        }
        if (dst->nb[0] == 4) {
          if (0 < lVar15) {
            lVar11 = pgVar10->ne[0];
            lVar12 = dst->ne[0];
            iVar2 = dst->op_params[2];
            iVar3 = dst->op_params[0];
            iVar4 = dst->op_params[1];
            iVar5 = dst->op_params[4];
            local_d8 = 0;
            local_118 = 0;
            iVar6 = dst->op_params[3];
            iVar7 = dst->op_params[5];
            pvVar13 = dst->data;
            lVar17 = lVar25 * lVar11;
            lVar30 = (long)params->ith;
            iVar8 = params->nth;
            lVar14 = pgVar9->ne[1];
            do {
              if (lVar30 < lVar28) {
                local_108 = lVar30;
                local_f8 = lVar17 * lVar30;
                do {
                  if (0 < lVar24) {
                    local_100 = 0;
                    do {
                      if (0 < lVar12) {
                        lVar20 = 0;
                        local_c0 = (long)iVar2;
                        do {
                          fVar36 = 0.0;
                          if (0 < lVar25) {
                            lVar33 = 0;
                            lVar34 = local_f8;
                            do {
                              if (0 < lVar11) {
                                lVar21 = (iVar6 + local_100) - lVar33 * iVar7;
                                lVar26 = local_c0;
                                lVar31 = lVar34;
                                lVar32 = lVar11;
                                do {
                                  lVar18 = lVar26 / (long)iVar3;
                                  if (lVar26 % (long)iVar3 == 0) {
                                    if (iVar1 == 1) {
                                      lVar19 = lVar21 / (long)iVar4;
                                      if (lVar21 % (long)iVar4 != 0) goto LAB_0014125d;
                                    }
                                    else {
                                      lVar19 = 0;
                                    }
                                    if ((((-1 < lVar18) && (lVar18 < lVar14)) && (-1 < lVar19)) &&
                                       (lVar19 < lVar29)) {
                                      fVar36 = fVar36 + *(float *)((long)pgVar9->data +
                                                                  lVar31 * 4 +
                                                                  (lVar18 + (lVar19 + local_d8) *
                                                                            lVar14) *
                                                                  lVar17 * lVar28 * 4);
                                    }
                                  }
LAB_0014125d:
                                  lVar26 = lVar26 - iVar5;
                                  lVar31 = lVar31 + 1;
                                  lVar32 = lVar32 + -1;
                                } while (lVar32 != 0);
                              }
                              lVar33 = lVar33 + 1;
                              lVar34 = lVar34 + lVar11;
                            } while (lVar33 != lVar25);
                          }
                          local_c0 = local_c0 + 1;
                          *(float *)((long)pvVar13 +
                                    lVar20 * 4 +
                                    local_100 * lVar12 * 4 + local_108 * iVar16 + local_118 * iVar23
                                    ) = fVar36;
                          lVar20 = lVar20 + 1;
                        } while (lVar20 != lVar12);
                      }
                      local_100 = local_100 + 1;
                    } while (local_100 != lVar24);
                  }
                  local_108 = local_108 + iVar8;
                  local_f8 = local_f8 + lVar17 * iVar8;
                } while (local_108 < lVar28);
              }
              local_d8 = local_d8 + lVar29;
              local_118 = local_118 + 1;
            } while (local_118 != lVar15);
          }
          return;
        }
        pcVar22 = "nb0 == sizeof(float)";
        uVar27 = 0x171c;
      }
      else {
        pcVar22 = "dst->type == GGML_TYPE_F32";
        uVar27 = 0x16ff;
      }
    }
    else {
      pcVar22 = "src1->type == GGML_TYPE_F32";
      uVar27 = 0x16fe;
    }
  }
  else {
    pcVar22 = "src0->type == GGML_TYPE_F32";
    uVar27 = 0x16fd;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar27,"GGML_ASSERT(%s) failed",pcVar22);
}

Assistant:

void ggml_compute_forward_im2col_back_f32(
        const ggml_compute_params * params,
              ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0]; // gradients of forward pass output
    const ggml_tensor * src1 = dst->src[1]; // convolution kernel

    GGML_ASSERT(src0->type == GGML_TYPE_F32);
    GGML_ASSERT(src1->type == GGML_TYPE_F32);
    GGML_ASSERT( dst->type == GGML_TYPE_F32);

    GGML_TENSOR_BINARY_OP_LOCALS;

    const int32_t s0 = ((const int32_t *)(dst->op_params))[0];
    const int32_t s1 = ((const int32_t *)(dst->op_params))[1];
    const int32_t p0 = ((const int32_t *)(dst->op_params))[2];
    const int32_t p1 = ((const int32_t *)(dst->op_params))[3];
    const int32_t d0 = ((const int32_t *)(dst->op_params))[4];
    const int32_t d1 = ((const int32_t *)(dst->op_params))[5];
    const bool is_2D = ((const int32_t *)(dst->op_params))[6] == 1;

    const int ith = params->ith;
    const int nth = params->nth;

    const int64_t N  = is_2D ? ne3 : ne2;
    const int64_t IC = is_2D ? ne2 : ne1;
    const int64_t IH = is_2D ? ne1 : 1;
    const int64_t IW = ne0;

    const int64_t KH = is_2D ? ne11 : 1;
    const int64_t KW = ne10;

    const int64_t OH = is_2D ? ne02 : 1;
    const int64_t OW = ne01;

    int ofs0 = is_2D ? nb3 : nb2;
    int ofs1 = is_2D ? nb2 : nb1;

    GGML_ASSERT(nb0  == sizeof(float));

    // im2col: [N, IC, IH, IW] => [N, OH, OW, IC*KH*KW]
    {
        float * const wdata = (float *) dst->data;

        for (int64_t in = 0; in < N; in++) {
            for (int64_t iic = ith; iic < IC; iic += nth) {
                for (int64_t iih = 0; iih < IH; iih++) {
                    for (int64_t iiw = 0; iiw < IW; iiw++) {

                        // micro kernel
                        float grad = 0.0f;
                        for (int64_t ikh = 0; ikh < KH; ikh++) {
                            for (int64_t ikw = 0; ikw < KW; ikw++) {
                                // For s0 > 1 some values were skipped over in the forward pass.
                                // These values have tmpw % s0 != 0 and need to be skipped in the backwards pass as well.
                                const int64_t tmpw = (iiw + p0 - ikw*d0);
                                if (tmpw % s0 != 0) {
                                    continue;
                                }
                                const int64_t iow = tmpw / s0;

                                // Equivalent logic as above except for s1.
                                int64_t ioh;
                                if (is_2D) {
                                    const int64_t tmph = iih + p1 - ikh*d1;

                                    if (tmph % s1 != 0) {
                                        continue;
                                    }

                                    ioh = tmph / s1;
                                } else {
                                    ioh = 0;
                                }

                                if (iow < 0 || iow >= OW || ioh < 0 || ioh >= OH) {
                                    continue;
                                }

                                const float * const grad_in = (const float *) src0->data
                                    + (in*OH*OW + ioh*OW + iow)*(IC*KH*KW); // [IC, KH, KW]
                                grad += grad_in[iic*(KH*KW) + ikh*KW + ikw];
                            }
                        }
                        float * dst_data = (float *)((char *) wdata + (in*ofs0 + iic*ofs1)); // [IH, IW]
                        dst_data[iih*IW + iiw] = grad;
                    }
                }
            }
        }
    }
}